

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

HttpResponse * __thiscall
HttpClient::RunRequest
          (HttpResponse *__return_storage_ptr__,HttpClient *this,string *url,string *type)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  string *psVar5;
  HttpResponse *this_00;
  bool bVar6;
  URL *this_01;
  undefined8 *puVar7;
  long *plVar8;
  long *plVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  undefined8 uVar13;
  TCPClient client;
  HttpResponse *response;
  string message;
  string result;
  TCPClient local_3a1;
  string local_3a0;
  HttpResponse *local_380;
  ulong *local_378;
  long local_370;
  ulong local_368 [2];
  undefined8 *local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  ulong *local_338;
  long local_330;
  ulong local_328;
  long lStack_320;
  undefined8 *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  Log local_f8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_380 = __return_storage_ptr__;
  this_01 = (URL *)operator_new(0x140);
  pcVar3 = (url->_M_dataplus)._M_p;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,pcVar3 + url->_M_string_length);
  URL::URL(this_01,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_2d8 = local_2c8;
  local_2d0 = 0;
  local_2c8[0] = 0;
  pcVar3 = (type->_M_dataplus)._M_p;
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,pcVar3,pcVar3 + type->_M_string_length);
  std::__cxx11::string::append((char *)&local_378);
  URL::GetRelativePath_abi_cxx11_(&local_298,this_01);
  uVar12 = 0xf;
  if (local_378 != local_368) {
    uVar12 = local_368[0];
  }
  if (uVar12 < local_298._M_string_length + local_370) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      uVar13 = local_298.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_298._M_string_length + local_370) goto LAB_0010545e;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_378);
  }
  else {
LAB_0010545e:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_298._M_dataplus._M_p);
  }
  local_358 = &local_348;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_348 = *puVar1;
    uStack_340 = puVar7[3];
  }
  else {
    local_348 = *puVar1;
    local_358 = (undefined8 *)*puVar7;
  }
  local_350 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_358);
  plVar9 = plVar8 + 2;
  if ((long *)*plVar8 == plVar9) {
    local_228 = *plVar9;
    lStack_220 = plVar8[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar9;
    local_238 = (long *)*plVar8;
  }
  local_230 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_328 = *puVar10;
    lStack_320 = plVar8[3];
    local_338 = &local_328;
  }
  else {
    local_328 = *puVar10;
    local_338 = (ulong *)*plVar8;
  }
  local_330 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  URL::GetHostName_abi_cxx11_(&local_2b8,this_01);
  uVar12 = 0xf;
  if (local_338 != &local_328) {
    uVar12 = local_328;
  }
  if (uVar12 < local_2b8._M_string_length + local_330) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      uVar13 = local_2b8.field_2._M_allocated_capacity;
    }
    if (local_2b8._M_string_length + local_330 <= (ulong)uVar13) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_338);
      goto LAB_0010560b;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2b8._M_dataplus._M_p);
LAB_0010560b:
  local_318 = &local_308;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_308 = *puVar1;
    uStack_300 = puVar7[3];
  }
  else {
    local_308 = *puVar1;
    local_318 = (undefined8 *)*puVar7;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_318);
  plVar9 = plVar8 + 2;
  if ((long *)*plVar8 == plVar9) {
    local_208 = *plVar9;
    lStack_200 = plVar8[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar9;
    local_218 = (long *)*plVar8;
  }
  local_210 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_218);
  paVar2 = &local_3a0.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_3a0.field_2._M_allocated_capacity = *psVar11;
    local_3a0.field_2._8_8_ = plVar8[3];
    local_3a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_3a0.field_2._M_allocated_capacity = *psVar11;
    local_3a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_3a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  this_00 = local_380;
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if (local_378 != local_368) {
    operator_delete(local_378);
  }
  URL::GetHostName_abi_cxx11_(&local_3a0,this_01);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,0x10819e);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_258.field_2._M_allocated_capacity = *psVar11;
    local_258.field_2._8_8_ = plVar8[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar11;
    local_258._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_258._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  Log::Add(&this->_log,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  URL::GetPortNumber_abi_cxx11_(&local_3a0,this_01);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,0x108099);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_278.field_2._M_allocated_capacity = *psVar11;
    local_278.field_2._8_8_ = plVar8[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar11;
    local_278._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_278._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  Log::Add(&this->_log,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  std::operator+(&local_50,"Message: \n",&local_2f8);
  Log::Add(&this->_log,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  bVar6 = URL::IsSSL(this_01);
  if (bVar6) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"Use https for the call","");
    Log::Add(&this->_log,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    URL::GetHostName_abi_cxx11_(&local_70,this_01);
    URL::GetPortNumber_abi_cxx11_(&local_90,this_01);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_2f8._M_dataplus._M_p,
               local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
    TCPClient::SendOverSSL(&local_3a0,&local_3a1,&local_70,&local_90,&local_158);
    std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    psVar5 = &local_70;
  }
  else {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Use http for the call","")
    ;
    Log::Add(&this->_log,&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    URL::GetHostName_abi_cxx11_(&local_b0,this_01);
    URL::GetPortNumber_abi_cxx11_(&local_d0,this_01);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_2f8._M_dataplus._M_p,
               local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
    TCPClient::Send(&local_3a0,&local_3a1,&local_b0,&local_d0,&local_198);
    std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    psVar5 = &local_b0;
  }
  puVar4 = *(undefined1 **)((psVar5->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 != &psVar5->field_2) {
    operator_delete(puVar4);
  }
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"Request was made, parsing result","");
  Log::Add(&this->_log,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_2d8,local_2d8 + local_2d0);
  paVar2 = &local_f8._logText.field_2;
  pcVar3 = (this->_log)._logText._M_dataplus._M_p;
  local_f8._logText._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + (this->_log)._logText._M_string_length);
  local_f8._printFunction = (this->_log)._printFunction;
  HttpResponse::HttpResponse(this_00,&local_1d8,this_01,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._logText._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._logText._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"Response was parsed sucessfully","");
  Log::Add(&this->_log,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  return this_00;
}

Assistant:

HttpResponse HttpClient::RunRequest(string url, string type) {
  URL* urlObject = new URL(url);
  TCPClient client;
  string message, result;
  message = type + " " + urlObject->GetRelativePath() + " HTTP/1.1\r\n" \
            + "Host: " + urlObject->GetHostName() + "\r\n" \
            + "\r\n";

  _log.Add("Making call with hostname: " + urlObject->GetHostName());
  _log.Add("Port number: " + urlObject->GetPortNumber());
  _log.Add("Message: \n" + message);

  if (urlObject->IsSSL()) {
    _log.Add("Use https for the call");
    result = client.SendOverSSL(urlObject->GetHostName(),
                                urlObject->GetPortNumber(), message);
  } else {
    _log.Add("Use http for the call");
    result = client.Send(urlObject->GetHostName(),
                         urlObject->GetPortNumber(), message);
  }
  _log.Add("Request was made, parsing result");
  HttpResponse response(result, urlObject, _log);
  _log.Add("Response was parsed sucessfully");
  return response;
}